

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_inc(void)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  byte bVar4;
  vm_register *pvVar5;
  undefined4 *puVar6;
  ushort uVar7;
  byte bVar8;
  uint uVar9;
  
  pvVar5 = registe_ptr;
  bVar1 = code_ptr[registe_ptr->IP + 1];
  bVar4 = bVar1 >> 4;
  if ((bVar1 & 0xf) == 2) {
    uVar3 = *register_list[bVar4];
    uVar9 = uVar3 + 1;
    *register_list[bVar4] = uVar9;
    if (uVar9 != 0) {
      pvVar5->flag[0] = '\x01';
      if (uVar3 < 0x7fffffff) {
        pvVar5->flag[1] = '\x01';
        return 1;
      }
      pvVar5->flag[1] = '\0';
      return 1;
    }
LAB_00103329:
    pvVar5->flag[0] = '\0';
  }
  else {
    if ((bVar1 & 0xf) == 1) {
      uVar2 = (ushort)*register_list[bVar4];
      uVar7 = uVar2 + 1;
      *(ushort *)register_list[bVar4] = uVar7;
      if (uVar7 == 0) goto LAB_00103329;
      if (uVar2 < 0x7fff) goto LAB_00103309;
      if (-1 < (short)uVar7) {
        return 1;
      }
    }
    else {
      if ((bVar1 & 0xf) != 0) {
        puVar6 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar6 = 0xf6;
        __cxa_throw(puVar6,&int::typeinfo,0);
      }
      bVar1 = (byte)*register_list[bVar4];
      bVar8 = bVar1 + 1;
      *(byte *)register_list[bVar4] = bVar8;
      pvVar5 = registe_ptr;
      if (bVar8 == 0) goto LAB_00103329;
      if (bVar1 < 0x7f) {
LAB_00103309:
        pvVar5->flag[0] = '\x01';
        pvVar5->flag[1] = '\x01';
        return 1;
      }
      if (-1 < (char)bVar8) {
        return 1;
      }
    }
    pvVar5->flag[0] = '\x01';
    pvVar5->flag[1] = '\0';
  }
  return 1;
}

Assistant:

int do_inc(){
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 1] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 1] % 0x10;
	switch (low)
	{
	case 0: {
		char*Ra = (char *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	case 1: {
		int16_t *Ra = (int16_t *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	case 2: {
		unsigned *Ra = (unsigned *)register_list[high];
		++*Ra;
		set_flag(*Ra);
		break;
	}
	default:
	{
		throw(LVM_EXECUTE_ERROR);
		break;
	}
	}
	return LVM_SUCCESS;
}